

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# konvert.h
# Opt level: O0

int konvert::atoi<int,unsigned_int>(char *ch)

{
  int iVar1;
  uint uVar2;
  uint32_t *xc;
  int sign;
  uint res;
  uint32_t *xcx;
  uchar cx [4];
  char *ch_local;
  int local_4;
  
  local_4 = 1;
  if (*ch == '-') {
    local_4 = -1;
  }
  ch_local = ch;
  if (local_4 < 0) {
    ch_local = ch + 1;
  }
  xc = (uint32_t *)(ch_local + 1);
  res = (int)*ch_local - 0x30;
  if (res < 10) {
    while( true ) {
      uVar2 = *xc + 0xcfcfcfd0;
      cx[3] = (uchar)(uVar2 >> 0x18);
      cx[2] = (uchar)(uVar2 >> 0x10);
      cx[1] = (uchar)(uVar2 >> 8);
      cx[0] = (uchar)uVar2;
      if (9 < cx[0]) break;
      iVar1 = res * 10 + (uVar2 & 0xff);
      if (9 < cx[1]) {
        return iVar1 * local_4;
      }
      iVar1 = iVar1 * 10 + (uint)cx[1];
      if (9 < cx[2]) {
        return iVar1 * local_4;
      }
      iVar1 = iVar1 * 10 + (uint)cx[2];
      if (9 < cx[3]) {
        return iVar1 * local_4;
      }
      res = iVar1 * 10 + (uint)cx[3];
      xc = xc + 1;
    }
    local_4 = res * local_4;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

inline itype atoi(const char *ch){
    unsigned char cx[4];
    uint32_t *xcx  = (uint32_t *)cx;
    utype res;
    int sign = (*ch == '-') ? -1 : 1;
    if(sign<0) ch++;

    if((res = (unsigned)(*ch++ - 0x30)) >= 10) return 0;

    uint32_t *xc = (uint32_t *)ch;

    while(true){
      *xcx = (*xc++) - 0x30303030;
      if( cx[0] <= 9 ) res = res*10 + cx[0]; else return res * sign;
      if( cx[1] <= 9 ) res = res*10 + cx[1]; else return res * sign;
      if( cx[2] <= 9 ) res = res*10 + cx[2]; else return res * sign;
      if( cx[3] <= 9 ) res = res*10 + cx[3]; else return res * sign;
    }
  }